

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O0

void __thiscall bitfoot::Bitfoot::AddEpCaps<true>(Bitfoot *this)

{
  bool bVar1;
  ulong local_20;
  uint64_t pawns;
  Bitfoot *pBStack_10;
  int from;
  Bitfoot *this_local;
  
  pBStack_10 = this;
  if (this->ep == 0x40) {
    __assert_fail("ep != NoSquare",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xb36,"void bitfoot::Bitfoot::AddEpCaps() [color = true]");
  }
  local_20 = *(ulong *)(_PAWN_ATK + (long)this->ep * 8) & this->pc[3];
  while (local_20 != 0) {
    PopLowSquare(&local_20,(int *)((long)&pawns + 4));
    bVar1 = Pinned<true>(this,pawns._4_4_,this->ep);
    if ((!bVar1) && (bVar1 = EpPinned<true>(this,pawns._4_4_,this->ep), !bVar1)) {
      AddMove<true,(bitfoot::MoveType)5>(this,3,pawns._4_4_,this->ep,100,2,0);
    }
  }
  return;
}

Assistant:

inline void AddEpCaps() {
    assert(ep != NoSquare);
    int from;
    uint64_t pawns = (_PAWN_ATK[!color][ep] & pc[color|Pawn]);
    while (pawns) {
      PopLowSquare(pawns, from);
      if (!Pinned<color>(from, ep) && !EpPinned<color>(from, ep)) {
        AddMove<color, EnPassant>((color|Pawn), from, ep,
                                  PawnValue, ((!color)|Pawn), 0);
      }
    }
  }